

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

void __thiscall
ExternalFixupMembersImport_BadMember_Test::TestBody(ExternalFixupMembersImport_BadMember_Test *this)

{
  pointer *__ptr;
  char *message;
  char *in_R9;
  error_code eVar1;
  string_mapping imported_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_180;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  AssertHelper local_148;
  parser<pstore::exchange::import_ns::callbacks> local_140;
  string_mapping local_98;
  
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98.strings_;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98.views_;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_98.lookup_._M_h._M_buckets = &local_98.lookup_._M_h._M_single_bucket;
  local_98.lookup_._M_h._M_bucket_count = 1;
  local_98.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98.lookup_._M_h._M_element_count = 0;
  local_98.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_98.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_98.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_168 = (undefined1  [8])&local_158;
  local_98.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_98.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_98.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_98.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"{ \"bad\":true }","");
  anon_unknown.dwarf_431e0c::ExternalFixupMembersImport::parse
            (&local_140,(string *)local_168,&(this->super_ExternalFixupMembersImport).db_,&local_98)
  ;
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
  }
  local_178[0] = local_140.error_._M_value != 0;
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_140.error_._M_value == 0) {
    testing::Message::Message((Message *)&local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_180._M_head_impl + 0x10),"Expected the parse to fail",0x1a);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_168,(internal *)local_178,(AssertionResult *)0x1d9922,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x268,(char *)local_168);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    if (local_180._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_180._M_head_impl + 8))();
    }
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
  }
  eVar1 = pstore::exchange::import_ns::make_error_code(unrecognized_xfixup_key);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar1._M_cat;
  local_178._0_4_ = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_168,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::unrecognized_xfixup_key)",
             &local_140.error_,(error_code *)local_178);
  if (local_168[0] == (string)0x0) {
    testing::Message::Message((Message *)local_178);
    if (local_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x26a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_178._4_4_,local_178._0_4_) + 8))();
    }
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,local_160);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.string_._M_dataplus._M_p != &local_140.string_.field_2) {
    operator_delete(local_140.string_._M_dataplus._M_p,
                    local_140.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_140.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_140.stack_.c);
  if (local_140.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_140.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_98);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, BadMember) {
    pstore::exchange::import_ns::string_mapping imported_names;
    auto const & parser = this->parse (R"({ "bad":true })", &db_, imported_names);
    EXPECT_TRUE (parser.has_error ()) << "Expected the parse to fail";
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::unrecognized_xfixup_key));
}